

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.h
# Opt level: O0

NullableValue<kj::Rc<kj::Refcounted>_> * __thiscall
kj::_::NullableValue<kj::Rc<kj::Refcounted>_>::operator=
          (NullableValue<kj::Rc<kj::Refcounted>_> *this,
          NullableValue<kj::Rc<kj::Refcounted>_> *other)

{
  Rc<kj::Refcounted> *params;
  NullableValue<kj::Rc<kj::Refcounted>_> *other_local;
  NullableValue<kj::Rc<kj::Refcounted>_> *this_local;
  
  if (other != this) {
    if ((this->isSet & 1U) != 0) {
      this->isSet = false;
      dtor<kj::Rc<kj::Refcounted>>(&(this->field_1).value);
    }
    if ((other->isSet & 1U) != 0) {
      params = mv<kj::Rc<kj::Refcounted>>(&(other->field_1).value);
      ctor<kj::Rc<kj::Refcounted>,kj::Rc<kj::Refcounted>>(&(this->field_1).value,params);
      this->isSet = true;
    }
  }
  return this;
}

Assistant:

inline NullableValue& operator=(NullableValue&& other) {
    if (&other != this) {
      // Careful about throwing destructors/constructors here.
      if (isSet) {
        isSet = false;
        dtor(value);
      }
      if (other.isSet) {
        ctor(value, kj::mv(other.value));
        isSet = true;
      }
    }
    return *this;
  }